

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall spvtools::opt::analysis::Type::IsUniqueType(Type *this)

{
  return (bool)((byte)(0x21ff >> ((byte)this->kind_ & 0x1f)) & 1 | kPointer < this->kind_);
}

Assistant:

bool Type::IsUniqueType() const {
  switch (kind_) {
    case kPointer:
    case kStruct:
    case kArray:
    case kRuntimeArray:
    case kNodePayloadArrayAMDX:
      return false;
    default:
      return true;
  }
}